

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cI16,cBGRA,bBlend>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063c8d6_caseD_0:
    if (0 < count) {
      pbVar7 = pin + 1;
      lVar6 = 0;
      do {
        pout[lVar6 * 4 + 2] =
             (BYTE)((uint)*pbVar7 * inf->alpha + (uint)pout[lVar6 * 4 + 2] * inf->invalpha >> 0x10);
        pout[lVar6 * 4 + 1] =
             (BYTE)((uint)*pbVar7 * inf->alpha + (uint)pout[lVar6 * 4 + 1] * inf->invalpha >> 0x10);
        pout[lVar6 * 4] =
             (BYTE)((uint)*pbVar7 * inf->alpha + (uint)pout[lVar6 * 4] * inf->invalpha >> 0x10);
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar7 = pbVar7 + step;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063c8d6_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar7 = pin + 1;
        lVar6 = 0;
        do {
          bVar1 = *pbVar7 >> 4;
          pout[lVar6 * 4 + 2] =
               (BYTE)((uint)IcePalette[bVar1][0] * inf->alpha +
                      (uint)pout[lVar6 * 4 + 2] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 1] =
               (BYTE)((uint)IcePalette[bVar1][1] * inf->alpha +
                      (uint)pout[lVar6 * 4 + 1] * inf->invalpha >> 0x10);
          pout[lVar6 * 4] =
               (BYTE)((uint)IcePalette[bVar1][2] * inf->alpha +
                      (uint)pout[lVar6 * 4] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 3] = 0xff;
          lVar6 = lVar6 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar7 = pin + 1;
        lVar6 = 0;
        do {
          iVar9 = (uint)*pbVar7 * inf->blendcolor[3];
          iVar3 = inf->blendcolor[1];
          iVar4 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] =
               (BYTE)(((uint)(inf->blendcolor[0] + iVar9) >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 2] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 1] =
               (BYTE)(((uint)(iVar3 + iVar9) >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 1] * inf->invalpha >> 0x10);
          pout[lVar6 * 4] =
               (BYTE)(((uint)(iVar9 + iVar4) >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 3] = 0xff;
          lVar6 = lVar6 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar7 = pin + 1;
        lVar6 = 0;
        do {
          bVar1 = *pbVar7;
          iVar3 = inf->blendcolor[1];
          iVar4 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] =
               (BYTE)((inf->blendcolor[0] * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 2] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 1] =
               (BYTE)((iVar3 * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 1] * inf->invalpha >> 0x10);
          pout[lVar6 * 4] =
               (BYTE)(((uint)bVar1 * iVar4 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4] * inf->invalpha >> 0x10);
          pout[lVar6 * 4 + 3] = 0xff;
          lVar6 = lVar6 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar6);
      }
      break;
    default:
      lVar6 = (long)inf->blend;
      if (lVar6 < 0x21) {
        if (0 < count && BLEND_ICEMAP < inf->blend) {
          pbVar7 = pin + 1;
          lVar6 = 0;
          do {
            bVar1 = *pbVar7;
            pout[lVar6 * 4 + 2] =
                 (BYTE)(inf->alpha * (uint)bVar1 + (uint)pout[lVar6 * 4 + 2] * inf->invalpha >> 0x10
                       );
            pout[lVar6 * 4 + 1] =
                 (BYTE)(inf->alpha * (uint)bVar1 + (uint)pout[lVar6 * 4 + 1] * inf->invalpha >> 0x10
                       );
            pout[lVar6 * 4] =
                 (BYTE)((uint)bVar1 * inf->alpha + (uint)pout[lVar6 * 4] * inf->invalpha >> 0x10);
            pout[lVar6 * 4 + 3] = 0xff;
            lVar6 = lVar6 + 1;
            pbVar7 = pbVar7 + step;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        pbVar7 = pin + 1;
        lVar8 = 0;
        do {
          uVar10 = (ulong)*pbVar7;
          bVar1 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar6 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar6 * 0x518 + -0xa6ff);
          pout[lVar8 * 4 + 2] =
               (BYTE)((uint)*(byte *)((long)pFVar5 + uVar10 * 4 + lVar6 * 0x518 + -0xa6fe) *
                      inf->alpha + (uint)pout[lVar8 * 4 + 2] * inf->invalpha >> 0x10);
          pout[lVar8 * 4 + 1] =
               (BYTE)((uint)bVar2 * inf->alpha + (uint)pout[lVar8 * 4 + 1] * inf->invalpha >> 0x10);
          pout[lVar8 * 4] =
               (BYTE)((uint)bVar1 * inf->alpha + (uint)pout[lVar8 * 4] * inf->invalpha >> 0x10);
          pout[lVar8 * 4 + 3] = 0xff;
          lVar8 = lVar8 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar8);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}